

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O0

void Maj3_ManPrintSolution(Maj3_Man_t *p)

{
  uint uVar1;
  int iVar2;
  uint local_a8 [2];
  int pFanins [32];
  int nFanins;
  int iVar;
  int k;
  int i;
  Maj3_Man_t *p_local;
  
  printf("Realization of %d-input majority using %d MAJ3 gates:\n",(ulong)(uint)p->nVars,
         (ulong)(uint)p->nNodes);
  iVar = p->nObjs;
  while( true ) {
    iVar = iVar + -1;
    if (iVar < p->nVars) {
      return;
    }
    printf("%02d = MAJ(",(ulong)(uint)iVar);
    iVar2 = Maj3_ManFindFanin(p,iVar,(int *)local_a8);
    if (iVar2 != 3) break;
    for (nFanins = 0; nFanins < 3; nFanins = nFanins + 1) {
      uVar1 = pFanins[(long)nFanins + -2];
      if (((int)uVar1 < 0) || (p->nVars <= (int)uVar1)) {
        printf(" %02d",(ulong)uVar1);
      }
      else {
        printf(" %c",(ulong)(uVar1 + 0x61));
      }
    }
    printf(" )\n");
  }
  __assert_fail("nFanins == 3",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj3.c"
                ,0xcb,"void Maj3_ManPrintSolution(Maj3_Man_t *)");
}

Assistant:

static inline void Maj3_ManPrintSolution( Maj3_Man_t * p )
{
    int i, k, iVar, nFanins, pFanins[MAJ3_OBJS];
    printf( "Realization of %d-input majority using %d MAJ3 gates:\n", p->nVars, p->nNodes );
//    for ( i = p->nVars; i < p->nObjs; i++ )
    for ( i = p->nObjs - 1; i >= p->nVars; i-- )
    {
        printf( "%02d = MAJ(", i );
        nFanins = Maj3_ManFindFanin( p, i, pFanins );
        assert( nFanins == 3 );
        for ( k = 0; k < 3; k++ )
        {
            iVar = pFanins[k];
            if ( iVar >= 0 && iVar < p->nVars )
                printf( " %c", 'a'+iVar );
            else
                printf( " %02d", iVar );
        }
        printf( " )\n" );
    }
}